

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

cmCommand * __thiscall
cmCTestSetTestsPropertiesCommand::Clone(cmCTestSetTestsPropertiesCommand *this)

{
  cmCommand *pcVar1;
  
  pcVar1 = (cmCommand *)operator_new(0x58);
  (pcVar1->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar1->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pcVar1->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pcVar1->Error)._M_dataplus._M_p = (pointer)&(pcVar1->Error).field_2;
  (pcVar1->Error)._M_string_length = 0;
  (pcVar1->Error).field_2._M_local_buf[0] = '\0';
  pcVar1->Makefile = (cmMakefile *)0x0;
  pcVar1->Enabled = true;
  (pcVar1->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006ba3f8;
  pcVar1[1].super_cmObject._vptr_cmObject = (_func_int **)this->TestHandler;
  return pcVar1;
}

Assistant:

virtual cmCommand* Clone()
    {
    cmCTestSetTestsPropertiesCommand* c
      = new cmCTestSetTestsPropertiesCommand;
    c->TestHandler = this->TestHandler;
    return c;
    }